

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::RealToBitsFunction::eval
          (RealToBitsFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RDI;
  real_t integer;
  ConstantValue val;
  ConstantValue *in_stack_ffffffffffffff58;
  EvalContext *this_00;
  SVInt *this_01;
  real_t local_80 [3];
  undefined4 local_68;
  SVInt local_58 [5];
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  this_01 = local_58;
  Expression::eval((Expression *)this_00,in_RDI);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x956b8b);
  if (bVar1) {
    integer = slang::ConstantValue::real(in_stack_ffffffffffffff58);
    local_80[0] = integer;
    std::bit_cast<unsigned_long,_slang::real_t>(local_80);
    SVInt::SVInt(this_01,(bitwidth_t)((ulong)this_00 >> 0x20),(uint64_t)in_RDI,
                 SUB81((ulong)integer.v >> 0x38,0));
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,(SVInt *)integer.v);
    SVInt::~SVInt(this_01);
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_ffffffffffffff58);
  }
  local_68 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x956c50);
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        return SVInt(64, std::bit_cast<uint64_t>(val.real()), false);
    }